

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *os,char2 *v)

{
  ostream *poVar1;
  const_reference pvVar2;
  char2 *v_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"(");
  pvVar2 = array<char,_2UL>::operator[](v,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)*pvVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pvVar2 = array<char,_2UL>::operator[](v,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)*pvVar2);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::char2 &v) {
  os << "(" << int(v[0]) << ", " << int(v[1]) << ")";
  return os;
}